

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int processCommandLine(int argc,char **argv,opt_t *opt)

{
  undefined4 uVar1;
  opt_t *poVar2;
  int longIndex;
  opt_t *local_58;
  opt_t *local_50;
  opt_t *local_48;
  opt_t *local_40;
  opt_t *local_38;
  
  longIndex = 0;
  local_38 = (opt_t *)&opt->target;
  local_40 = (opt_t *)&opt->effect;
  local_48 = (opt_t *)&opt->detector;
  local_50 = (opt_t *)&opt->image;
  local_58 = (opt_t *)&opt->video;
  do {
    uVar1 = getopt_long_only(argc,argv,"",processCommandLine::s_longOptions,&longIndex);
    poVar2 = opt;
    switch(uVar1) {
    case 0:
      showHelp();
      exit(0);
    case 1:
      break;
    case 2:
      poVar2 = local_58;
      break;
    case 3:
      poVar2 = local_50;
      break;
    case 4:
      poVar2 = local_48;
      break;
    case 5:
      poVar2 = local_40;
      break;
    case 6:
      poVar2 = local_38;
      break;
    case 0xffffffff:
      return 0;
    default:
      fprintf(_stderr,"Invalid argument passed: %s",argv[(long)_optind + -1]);
      showHelp();
      exit(-1);
    }
    std::__cxx11::string::assign((char *)poVar2);
  } while( true );
}

Assistant:

int processCommandLine(int argc, char** argv, opt_t &opt) 
{
    enum OPTIONS 
    {
        OPT_HELP = 0,
        OPT_IN_FILE,
        OPT_OUT_VIDEO,
        OPT_OUT_IMAGE,
        OPT_DETECTOR,
        OPT_EFFECT,
        OPT_TARGET
    };

    const int noArgument = 0;
    const int requiredArgument = 1;

    static struct option s_longOptions[] = 
    {
            {"help",             noArgument,       NULL, OPT_HELP},
            {"file",             requiredArgument, NULL, OPT_IN_FILE},
            {"video",            requiredArgument, NULL, OPT_OUT_VIDEO},
            {"image",            requiredArgument, NULL, OPT_OUT_IMAGE},
            {"detector",         requiredArgument, NULL, OPT_DETECTOR},
            {"effect",           requiredArgument, NULL, OPT_EFFECT},
            {"target",           requiredArgument, NULL, OPT_TARGET},
            {NULL, 0, NULL, 0}
    };

    int longIndex = 0;
    int opt_idx = 0;

    while ((opt_idx = getopt_long_only(argc, argv, "", s_longOptions, &longIndex)) != -1) 
    {
        switch (opt_idx) 
        {
            case OPT_HELP:
                showHelp();
                std::exit(0);
            case OPT_IN_FILE:
                opt.filePath = optarg;
                break;
            case OPT_OUT_VIDEO:
                opt.video = optarg;
                break;
            case OPT_OUT_IMAGE:
                opt.image = optarg;
                break;
            case OPT_DETECTOR:
                opt.detector = optarg;
                break;
            case OPT_EFFECT:
                opt.effect = optarg;
                break;
            case OPT_TARGET:
                opt.target = optarg;
                break;
            default:
                fprintf(stderr, "Invalid argument passed: %s", argv[optind - 1]);
                showHelp();
                std::exit(-1);
        }
    }

    return 0;
}